

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void ActionUnserialize::
     SerReadWriteMany<DataStream,std::array<unsigned_char,4ul>&,char(&)[12],unsigned_int&,unsigned_char(&)[4]>
               (DataStream *s,array<unsigned_char,_4UL> *args,char (*args_1) [12],uint *args_2,
               uchar (*args_3) [4])

{
  uint *__nbytes;
  long in_FS_OFFSET;
  uint32_t obj;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  DataStream::read(s,(int)args,(void *)0x4,(size_t)args_2);
  DataStream::read(s,(int)args_1,(void *)0xc,(size_t)__nbytes);
  DataStream::read(s,(int)&local_2c,(void *)0x4,(size_t)__nbytes);
  *args_2 = local_2c;
  DataStream::read(s,(int)args_3,(void *)0x4,(size_t)__nbytes);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }